

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int __thiscall Polynomial::evaluate(Polynomial *this,int *pt)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  value_type extraout_EAX;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int *piVar8;
  double __x;
  operand *a;
  int local_20;
  int i_2;
  int i_1;
  int i;
  int *pt_local;
  Polynomial *this_local;
  
  for (i_2 = 0; i_2 < this->mNumStates; i_2 = i_2 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->mEvaluationValues,(long)i_2);
    *pvVar5 = i_2;
  }
  for (local_20 = 0; local_20 < this->mNumVariables; local_20 = local_20 + 1) {
    vVar1 = pt[local_20];
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->mEvaluationValues,(long)(local_20 + this->mNumStates));
    *pvVar5 = vVar1;
  }
  for (a._4_4_ = this->mFirstOperation; a._4_4_ <= this->mResultLocation; a._4_4_ = a._4_4_ + 1) {
    pvVar6 = std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::operator[]
                       (&this->mOperands,(long)(a._4_4_ - this->mFirstOperation));
    switch(pvVar6->op) {
    case PLUS:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      iVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,1);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      iVar4 = *pvVar5;
      iVar2 = this->mNumStates;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = (iVar3 + iVar4) % iVar2;
      break;
    case TIMES:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      iVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,1);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      iVar4 = *pvVar5;
      iVar2 = this->mNumStates;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = (iVar3 * iVar4) % iVar2;
      break;
    case POWER:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      std::vector<int,_std::allocator<int>_>::operator[](&this->mEvaluationValues,(long)*pvVar5);
      std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,1);
      exp(this,__x);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = extraout_EAX;
      break;
    case NOT:
      iVar3 = this->mNumStates;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      iVar4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = (iVar3 + -1) - iVar4;
      break;
    case MAX:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar7);
      piVar8 = std::max<int>(pvVar5,pvVar7);
      iVar3 = *piVar8;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = iVar3;
      break;
    case MIN:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar5);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar6->args,1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)*pvVar7);
      piVar8 = std::min<int>(pvVar5,pvVar7);
      iVar3 = *piVar8;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mEvaluationValues,(long)a._4_4_);
      *pvVar5 = iVar3;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->mEvaluationValues,(long)this->mResultLocation);
  return *pvVar5;
}

Assistant:

int Polynomial::evaluate(const int pt[]) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues[i] = i;
  for (int i=0; i<mNumVariables; i++)
    mEvaluationValues[i + mNumStates] = pt[i];
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                + mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::TIMES:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                * mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::POWER:
        mEvaluationValues[i] = exp(mEvaluationValues[a.args[0]], a.args[1]);
        break;
      case operandType::MAX:
        mEvaluationValues[i] = std::max(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::MIN:
        mEvaluationValues[i] = std::min(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::NOT:
        mEvaluationValues[i] = mNumStates - 1 - mEvaluationValues[a.args[0]];
        break;
      }
    }
  return mEvaluationValues[mResultLocation];
}